

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::CheckEntireMessageConsumedAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  bool bVar1;
  int iVar2;
  uint8 *puVar3;
  int iVar4;
  
  bVar1 = this->legitimate_message_end_;
  this->current_limit_ = limit;
  iVar2 = this->buffer_size_after_limit_;
  puVar3 = this->buffer_end_;
  this->buffer_end_ = puVar3 + iVar2;
  if (this->total_bytes_limit_ < limit) {
    limit = this->total_bytes_limit_;
  }
  iVar4 = this->total_bytes_read_ - limit;
  if (iVar4 == 0 || this->total_bytes_read_ < limit) {
    this->buffer_size_after_limit_ = 0;
  }
  else {
    this->buffer_size_after_limit_ = iVar4;
    this->buffer_end_ = puVar3 + iVar2 + -(long)iVar4;
  }
  this->legitimate_message_end_ = false;
  return bVar1;
}

Assistant:

inline bool CodedInputStream::ConsumedEntireMessage() {
  return legitimate_message_end_;
}